

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<TPZBlock::TNode>::Resize(TPZVec<TPZBlock::TNode> *this,int64_t newsize)

{
  ostream *poVar1;
  int64_t *piVar2;
  long lVar3;
  long lVar4;
  TNode *pTVar5;
  bool bVar6;
  
  if (newsize < 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ostream::flush();
  }
  lVar4 = this->fNElements;
  if (lVar4 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar5 = this->fStore;
      if (pTVar5 != (TNode *)0x0) {
        lVar4._0_4_ = pTVar5[-1].pos;
        lVar4._4_4_ = pTVar5[-1].dim;
        operator_delete__(&pTVar5[-1].pos,lVar4 << 4 | 8);
      }
      this->fStore = (TNode *)0x0;
    }
    else {
      piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize * 0x10 | 8)
      ;
      *piVar2 = newsize;
      pTVar5 = (TNode *)(piVar2 + 1);
      do {
        (pTVar5->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TNode_016a5b68;
        pTVar5->pos = 0;
        pTVar5->dim = 0;
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 != (TNode *)(piVar2 + newsize * 2 + 1));
      if (newsize <= lVar4) {
        lVar4 = newsize;
      }
      pTVar5 = this->fStore;
      lVar3 = 0;
      if (0 < lVar4) {
        lVar3 = lVar4;
      }
      lVar4 = 0x10;
      while (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6) {
        *(undefined8 *)((long)piVar2 + lVar4) = *(undefined8 *)((long)pTVar5 + lVar4 + -8);
        lVar4 = lVar4 + 0x10;
      }
      if (pTVar5 != (TNode *)0x0) {
        lVar3._0_4_ = pTVar5[-1].pos;
        lVar3._4_4_ = pTVar5[-1].dim;
        operator_delete__(&pTVar5[-1].pos,lVar3 << 4 | 8);
      }
      this->fStore = (TNode *)(piVar2 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}